

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O0

void MeshLib::Trait::updateUV(string *traitString,Point *p)

{
  double dVar1;
  double *pdVar2;
  allocator local_179;
  undefined1 local_178 [8];
  string attval;
  char str [256];
  allocator local_39;
  undefined1 local_38 [8];
  string attname;
  Point *p_local;
  string *traitString_local;
  
  attname.field_2._8_8_ = p;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"uv",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pdVar2 = Point::operator[](p,0);
  dVar1 = *pdVar2;
  pdVar2 = Point::operator[](p,1);
  sprintf(attval.field_2._M_local_buf + 8,"%g %g",dVar1,*pdVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_178,attval.field_2._M_local_buf + 8,&local_179);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  updateTraitString(traitString,(string *)local_38,(string *)local_178);
  std::__cxx11::string::~string((string *)local_178);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Trait::updateUV(std::string &traitString, Point p)
{
	std::string attname("uv");
	char str[256];
	sprintf(str, "%g %g", p[0], p[1]);
	std::string attval( str );
	Trait::updateTraitString ( traitString, attname, attval );
}